

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_0::DatagramPortImpl::send
          (DatagramPortImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  PromiseArena *pPVar1;
  undefined1 auVar2 [8];
  Disposer *pDVar3;
  DatagramPort DVar4;
  DatagramPortImpl *pDVar5;
  OwnPromiseNode node;
  uint uVar6;
  SocketAddress *pSVar7;
  iovec *piVar8;
  long lVar9;
  PromiseFulfiller<void> *pPVar10;
  void *pvVar11;
  size_t sVar12;
  long *plVar13;
  Disposer *elementCount;
  int iVar14;
  long lVar15;
  Disposer *pDVar16;
  TransformPromiseNodeBase *this_00;
  undefined4 in_register_00000034;
  _func_int **pp_Var17;
  undefined4 in_register_00000084;
  Iterator __end2;
  size_t *psVar18;
  Array<unsigned_char> extra;
  Fault f;
  Array<iovec> iov_heap;
  OwnPromiseNode intermediate;
  msghdr msg;
  iovec iov_stack [16];
  undefined1 local_200 [8];
  PromiseFulfiller<void> *local_1f8;
  Disposer *pDStack_1f0;
  PromiseFulfiller<void> *local_1e8;
  DatagramPort local_1e0;
  iovec *local_1d8;
  Disposer *pDStack_1d0;
  PromiseFulfiller<void> *local_1c8;
  Disposer *local_1c0;
  undefined1 local_1b8 [16];
  PromiseFulfiller<void> *local_1a8;
  NetworkAddressImpl *local_198;
  Disposer *local_190;
  DatagramPortImpl *local_188;
  OwnPromiseNode local_180;
  msghdr local_178;
  iovec local_138 [16];
  
  local_198 = (NetworkAddressImpl *)CONCAT44(in_register_00000084,__flags);
  pp_Var17 = (_func_int **)CONCAT44(in_register_00000034,__fd);
  local_178.msg_control = (void *)0x0;
  local_178.msg_controllen = 0;
  local_178.msg_iov = (iovec *)0x0;
  local_178.msg_iovlen = 0;
  local_178.msg_name = (void *)0x0;
  local_178.msg_namelen = 0;
  local_178._12_4_ = 0;
  local_178.msg_flags = 0;
  local_178._52_4_ = 0;
  pSVar7 = NetworkAddressImpl::chooseOneAddress(local_198);
  local_178.msg_name = &pSVar7->addr;
  local_178.msg_namelen = pSVar7->addrlen;
  pDVar16 = (Disposer *)0x400;
  if (__n < 0x400) {
    pDVar16 = (Disposer *)__n;
  }
  if (__n < 0x11) {
    local_1d8 = (iovec *)0x0;
    pDStack_1d0 = (Disposer *)0x0;
    local_1c8 = (PromiseFulfiller<void> *)0x0;
    piVar8 = local_138;
  }
  else {
    piVar8 = (iovec *)kj::_::HeapArrayDisposer::allocateImpl
                                (0x10,(size_t)pDVar16,(size_t)pDVar16,(_func_void_void_ptr *)0x0,
                                 (_func_void_void_ptr *)0x0);
    local_1c8 = (PromiseFulfiller<void> *)&kj::_::HeapArrayDisposer::instance;
    pDStack_1d0 = pDVar16;
    local_1d8 = piVar8;
  }
  if (__n != 0) {
    lVar9 = 8;
    sVar12 = __n;
    do {
      *(undefined8 *)((long)piVar8 + lVar9 + -8) = *(undefined8 *)((long)__buf + lVar9 + -8);
      *(undefined8 *)((long)&piVar8->iov_base + lVar9) = *(undefined8 *)((long)__buf + lVar9);
      lVar9 = lVar9 + 0x10;
      sVar12 = sVar12 - 1;
    } while (sVar12 != 0);
  }
  local_1f8 = (PromiseFulfiller<void> *)0x0;
  pDStack_1f0 = (Disposer *)0x0;
  local_1e8 = (PromiseFulfiller<void> *)0x0;
  local_1c0 = (Disposer *)__n;
  local_188 = this;
  if (0x400 < __n) {
    lVar9 = __n - 0x3ff;
    plVar13 = (long *)((long)__buf + 0x3ff8);
    elementCount = (Disposer *)0x0;
    do {
      elementCount = (Disposer *)((long)&elementCount->_vptr_Disposer + *plVar13);
      plVar13 = plVar13 + 2;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
    local_1b8._0_8_ =
         kj::_::HeapArrayDisposer::allocateImpl
                   (1,(size_t)elementCount,(size_t)elementCount,(_func_void_void_ptr *)0x0,
                    (_func_void_void_ptr *)0x0);
    pDVar3 = pDStack_1f0;
    pPVar10 = local_1f8;
    local_1a8 = (PromiseFulfiller<void> *)&kj::_::HeapArrayDisposer::instance;
    local_1b8._8_8_ = elementCount;
    local_190 = pDVar16;
    if (local_1f8 != (PromiseFulfiller<void> *)0x0) {
      local_1f8 = (PromiseFulfiller<void> *)0x0;
      pDStack_1f0 = (Disposer *)0x0;
      (**(local_1e8->super_PromiseRejector)._vptr_PromiseRejector)
                (local_1e8,pPVar10,1,pDVar3,pDVar3,0);
    }
    local_1f8 = (PromiseFulfiller<void> *)local_1b8._0_8_;
    pDStack_1f0 = (Disposer *)local_1b8._8_8_;
    sVar12 = 0x400;
    if (0x400 < __n) {
      sVar12 = __n;
    }
    local_1e8 = local_1a8;
    lVar9 = sVar12 - 0x3ff;
    psVar18 = (size_t *)((long)__buf + 0x3ff8);
    lVar15 = 0;
    do {
      memcpy((void *)((long)&(local_1f8->super_PromiseRejector)._vptr_PromiseRejector + lVar15),
             (void *)psVar18[-1],*psVar18);
      lVar15 = lVar15 + *psVar18;
      psVar18 = psVar18 + 2;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
    piVar8[(long)((long)&local_190[-1]._vptr_Disposer + 7)].iov_base = local_1f8;
    piVar8[(long)((long)&local_190[-1]._vptr_Disposer + 7)].iov_len = (size_t)pDStack_1f0;
    pDVar16 = local_190;
  }
  pDVar5 = local_188;
  local_178.msg_iov = piVar8;
  local_178.msg_iovlen = (size_t)pDVar16;
  do {
    pPVar10 = (PromiseFulfiller<void> *)sendmsg(*(int *)(pp_Var17 + 1),&local_178,0);
    if (-1 < (long)pPVar10) {
      iVar14 = 0;
      break;
    }
    uVar6 = kj::_::Debug::getOsErrorNumber(true);
    pDVar16 = (Disposer *)((ulong)pDVar16 & 0xffffffff);
    if (uVar6 != 0xffffffff) {
      pDVar16 = (Disposer *)(ulong)uVar6;
    }
    iVar14 = (int)pDVar16;
  } while (uVar6 == 0xffffffff);
  if (iVar14 == 0) {
    if ((long)pPVar10 < 0) {
      UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_200);
      auVar2 = local_200;
      pPVar1 = (PromiseArena *)
               ((SleepHooks *)&((PromiseArenaMember *)local_200)->arena)->_vptr_SleepHooks;
      if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_200 - (long)pPVar1) < 0x40) {
        pvVar11 = operator_new(0x400);
        this_00 = (TransformPromiseNodeBase *)((long)pvVar11 + 0x3c0);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (this_00,(OwnPromiseNode *)local_200,
                   kj::_::
                   SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1828:48)>
                   ::anon_class_32_3_8270f0b6_for_func::operator());
        *(undefined ***)((long)pvVar11 + 0x3c0) = &PTR_destroy_0070e380;
        *(_func_int ***)((long)pvVar11 + 0x3e0) = pp_Var17;
        *(void **)((long)pvVar11 + 1000) = __buf;
        *(Disposer **)((long)pvVar11 + 0x3f0) = local_1c0;
        *(NetworkAddressImpl **)((long)pvVar11 + 0x3f8) = local_198;
        *(void **)((long)pvVar11 + 0x3c8) = pvVar11;
      }
      else {
        ((SleepHooks *)&((PromiseArenaMember *)local_200)->arena)->_vptr_SleepHooks =
             (_func_int **)0x0;
        this_00 = (TransformPromiseNodeBase *)((long)local_200 + -0x40);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (this_00,(OwnPromiseNode *)local_200,
                   kj::_::
                   SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1828:48)>
                   ::anon_class_32_3_8270f0b6_for_func::operator());
        ((PromiseArenaMember *)((long)auVar2 + -0x40))->_vptr_PromiseArenaMember =
             (_func_int **)&PTR_destroy_0070e380;
        ((PromiseArenaMember *)((long)auVar2 + -0x20))->_vptr_PromiseArenaMember = pp_Var17;
        ((PromiseArenaMember *)((long)auVar2 + -0x20))->arena = (PromiseArena *)__buf;
        ((PromiseArenaMember *)((long)auVar2 + -0x10))->_vptr_PromiseArenaMember =
             (_func_int **)local_1c0;
        ((PromiseArenaMember *)((long)auVar2 + -0x10))->arena = (PromiseArena *)local_198;
        ((PromiseArenaMember *)((long)auVar2 + -0x40))->arena = pPVar1;
      }
      local_1b8._0_8_ = &DAT_005053bd;
      local_1b8._8_8_ = &DAT_0050541c;
      local_1a8 = (PromiseFulfiller<void> *)0x4c0000058b;
      local_180.ptr = &this_00->super_PromiseNode;
      kj::_::PromiseDisposer::
      appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                ((PromiseDisposer *)&local_1e0,&local_180,(SourceLocation *)local_1b8);
      node.ptr = local_180.ptr;
      (pDVar5->super_DatagramPort)._vptr_DatagramPort = local_1e0._vptr_DatagramPort;
      if ((TransformPromiseNodeBase *)local_180.ptr != (TransformPromiseNodeBase *)0x0) {
        local_180.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
      }
      auVar2 = local_200;
      if (local_200 != (undefined1  [8])0x0) {
        local_200 = (undefined1  [8])0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar2);
      }
    }
    else {
      local_1b8._0_8_ = pPVar10;
      kj::_::PromiseDisposer::
      alloc<kj::_::ImmediatePromiseNode<unsigned_long>,kj::_::PromiseDisposer,unsigned_long>
                ((PromiseDisposer *)&local_1e0,(unsigned_long *)local_1b8);
      DVar4._vptr_DatagramPort = local_1e0._vptr_DatagramPort;
      local_1e0._vptr_DatagramPort = (_func_int **)0x0;
      (pDVar5->super_DatagramPort)._vptr_DatagramPort = DVar4._vptr_DatagramPort;
    }
    pDVar16 = pDStack_1f0;
    pPVar10 = local_1f8;
    if (local_1f8 != (PromiseFulfiller<void> *)0x0) {
      local_1f8 = (PromiseFulfiller<void> *)0x0;
      pDStack_1f0 = (Disposer *)0x0;
      (**(local_1e8->super_PromiseRejector)._vptr_PromiseRejector)
                (local_1e8,pPVar10,1,pDVar16,pDVar16,0);
    }
    pDVar16 = pDStack_1d0;
    piVar8 = local_1d8;
    if (local_1d8 != (iovec *)0x0) {
      local_1d8 = (iovec *)0x0;
      pDStack_1d0 = (Disposer *)0x0;
      (**(local_1c8->super_PromiseRejector)._vptr_PromiseRejector)
                (local_1c8,piVar8,0x10,pDVar16,pDVar16,0);
    }
    return (ssize_t)pDVar5;
  }
  local_1e0._vptr_DatagramPort = (_func_int **)0x0;
  local_1b8._0_8_ = (PromiseFulfiller<void> *)0x0;
  local_1b8._8_8_ = (char *)0x0;
  kj::_::Debug::Fault::init
            ((Fault *)&local_1e0,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
            );
  kj::_::Debug::Fault::fatal((Fault *)&local_1e0);
}

Assistant:

Promise<size_t> DatagramPortImpl::send(
    ArrayPtr<const ArrayPtr<const byte>> pieces, NetworkAddress& destination) {
  struct msghdr msg;
  memset(&msg, 0, sizeof(msg));

  auto& addr = downcast<NetworkAddressImpl>(destination).chooseOneAddress();
  msg.msg_name = const_cast<void*>(implicitCast<const void*>(addr.getRaw()));
  msg.msg_namelen = addr.getRawSize();

  const size_t iovmax = kj::miniposix::iovMax();
  KJ_STACK_ARRAY(struct iovec, iov, kj::min(pieces.size(), iovmax), 16, 64);

  for (size_t i: kj::indices(pieces)) {
    iov[i].iov_base = const_cast<void*>(implicitCast<const void*>(pieces[i].begin()));
    iov[i].iov_len = pieces[i].size();
  }

  Array<byte> extra;
  if (pieces.size() > iovmax) {
    // Too many pieces, but we can't use multiple syscalls because they'd send separate
    // datagrams. We'll have to copy the trailing pieces into a temporary array.
    //
    // TODO(perf): On Linux we could use multiple syscalls via MSG_MORE or sendmsg/sendmmsg.
    size_t extraSize = 0;
    for (size_t i = iovmax - 1; i < pieces.size(); i++) {
      extraSize += pieces[i].size();
    }
    extra = kj::heapArray<byte>(extraSize);
    extraSize = 0;
    for (size_t i = iovmax - 1; i < pieces.size(); i++) {
      memcpy(extra.begin() + extraSize, pieces[i].begin(), pieces[i].size());
      extraSize += pieces[i].size();
    }
    iov.back().iov_base = extra.begin();
    iov.back().iov_len = extra.size();
  }

  msg.msg_iov = iov.begin();
  msg.msg_iovlen = iov.size();

  ssize_t n;
  KJ_NONBLOCKING_SYSCALL(n = sendmsg(fd, &msg, 0));
  if (n < 0) {
    // Write buffer full.
    return observer.whenBecomesWritable().then([this, pieces, &destination]() {
      return send(pieces, destination);
    });
  } else {
    // If less than the whole message was sent, then it was truncated, and there's nothing we can
    // do about that now.
    return n;
  }
}